

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.h
# Opt level: O2

RTPPacket * __thiscall jrtplib::RTPSourceData::GetNextPacket(RTPSourceData *this)

{
  _List_node_base *p_Var1;
  RTPPacket *pRVar2;
  
  if (this->validated == true) {
    p_Var1 = (this->packetlist).
             super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)&this->packetlist) {
      pRVar2 = (RTPPacket *)p_Var1[1]._M_next;
      std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::pop_front
                (&this->packetlist);
      return pRVar2;
    }
  }
  return (RTPPacket *)0x0;
}

Assistant:

inline RTPPacket *RTPSourceData::GetNextPacket()
{
	if (!validated)
		return 0;

	RTPPacket *p;

	if (packetlist.empty())
		return 0;
	p = *(packetlist.begin());
	packetlist.pop_front();
	return p;
}